

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btree_str_kv.cc
# Opt level: O0

void btree_str_kv_get_key(void *key,void *strbuf,size_t *len)

{
  ulong *in_RDX;
  void *in_RSI;
  undefined8 *in_RDI;
  key_len_t _keylen;
  key_len_t inflen;
  key_len_t keylen;
  void *key_ptr;
  undefined1 local_24 [2];
  ushort local_22;
  ushort *local_20;
  ulong *local_18;
  void *local_10;
  undefined8 *local_8;
  
  local_18 = in_RDX;
  local_10 = in_RSI;
  local_8 = in_RDI;
  memset(local_24,0xff,2);
  local_20 = (ushort *)*local_8;
  if (local_20 == (ushort *)0x0) {
    *local_18 = 0;
  }
  else {
    local_22 = *local_20 >> 8 | *local_20 << 8;
    memcpy(local_10,local_20 + 1,(ulong)local_22);
    *local_18 = (ulong)local_22;
  }
  return;
}

Assistant:

void btree_str_kv_get_key(void *key, void *strbuf, size_t *len)
{
    void *key_ptr;
    key_len_t keylen, inflen;
    key_len_t _keylen;

    memset(&inflen, 0xff, sizeof(key_len_t));

    memcpy(&key_ptr, key, sizeof(void *));
    if (key_ptr) {
        memcpy(&_keylen, key_ptr, sizeof(key_len_t));
        keylen = _endian_decode(_keylen);

        memcpy(strbuf, (uint8_t*)key_ptr + sizeof(key_len_t), keylen);
        *len = keylen;
    } else {
        *len = 0;
    }
}